

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_MissingReturnThrows_Test::~SemanticAnalyserTest_MissingReturnThrows_Test
          (SemanticAnalyserTest_MissingReturnThrows_Test *this)

{
  testing::Test::~Test((Test *)0x1e90fe);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, MissingReturnThrows)
{
  std::string source = R"SRC(
  fn func(): f32
  {
  }

  fn main(): f32
  {
   ret 0; 
  }
  )SRC";
  throwTest(source);
}